

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O0

int ZXing::DataMatrix::DMTextEncoder::EncodeChar(int c,string *sb)

{
  char *in_RSI;
  char cVar1;
  int in_EDI;
  int len;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  undefined4 local_4;
  
  cVar1 = (char)in_RSI;
  if (in_EDI == 0x20) {
    std::__cxx11::string::push_back(cVar1);
    local_4 = 1;
  }
  else if ((in_EDI < 0x30) || (0x39 < in_EDI)) {
    if ((in_EDI < 0x61) || (0x7a < in_EDI)) {
      if ((in_EDI < 0) || (0x1f < in_EDI)) {
        if (in_EDI < 0x30) {
          std::__cxx11::string::push_back(cVar1);
          std::__cxx11::string::push_back((char)in_RSI);
          local_4 = 2;
        }
        else if (in_EDI < 0x41) {
          std::__cxx11::string::push_back(cVar1);
          std::__cxx11::string::push_back((char)in_RSI);
          local_4 = 2;
        }
        else if ((in_EDI < 0x5b) || (0x5f < in_EDI)) {
          if (in_EDI == 0x60) {
            std::__cxx11::string::push_back(cVar1);
            std::__cxx11::string::push_back((char)in_RSI);
            local_4 = 2;
          }
          else if (in_EDI < 0x5b) {
            std::__cxx11::string::push_back(cVar1);
            std::__cxx11::string::push_back((char)in_RSI);
            local_4 = 2;
          }
          else if (in_EDI < 0x80) {
            std::__cxx11::string::push_back(cVar1);
            std::__cxx11::string::push_back((char)in_RSI);
            local_4 = 2;
          }
          else {
            std::__cxx11::string::append(in_RSI);
            iVar2 = 2;
            local_4 = EncodeChar((int)in_RSI,(string *)CONCAT44(2,in_stack_ffffffffffffffe8));
            local_4 = local_4 + iVar2;
          }
        }
        else {
          std::__cxx11::string::push_back(cVar1);
          std::__cxx11::string::push_back((char)in_RSI);
          local_4 = 2;
        }
      }
      else {
        std::__cxx11::string::push_back(cVar1);
        std::__cxx11::string::push_back((char)in_RSI);
        local_4 = 2;
      }
    }
    else {
      std::__cxx11::string::push_back(cVar1);
      local_4 = 1;
    }
  }
  else {
    std::__cxx11::string::push_back(cVar1);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int EncodeChar(int c, std::string& sb)
	{
		if (c == ' ') {
			sb.push_back('\3');
			return 1;
		}
		if (c >= '0' && c <= '9') {
			sb.push_back((char)(c - 48 + 4));
			return 1;
		}
		if (c >= 'a' && c <= 'z') {
			sb.push_back((char)(c - 97 + 14));
			return 1;
		}
		if (c >= '\0' && c <= '\x1f') {
			sb.push_back('\0'); //Shift 1 Set
			sb.push_back(c);
			return 2;
		}
		if (c <= '/') {
			sb.push_back('\1'); //Shift 2 Set
			sb.push_back((char)(c - 33));
			return 2;
		}
		if (c <= '@') {
			sb.push_back('\1'); //Shift 2 Set
			sb.push_back((char)(c - 58 + 15));
			return 2;
		}
		if (c >= '[' && c <= '_') {
			sb.push_back('\1'); //Shift 2 Set
			sb.push_back((char)(c - 91 + 22));
			return 2;
		}
		if (c == '\x60') {
			sb.push_back('\2'); //Shift 3 Set
			sb.push_back((char)(c - 96));
			return 2;
		}
		if (c <= 'Z') {
			sb.push_back('\2'); //Shift 3 Set
			sb.push_back((char)(c - 65 + 1));
			return 2;
		}
		if (c <= '\x7f') {
			sb.push_back('\2'); //Shift 3 Set
			sb.push_back((char)(c - 123 + 27));
			return 2;
		}
		sb.append("\1\x1e"); //Shift 2, Upper Shift
		int len = 2;
		len += EncodeChar(c - 128, sb);
		return len;
	}